

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float16 float16_add_m68k(float16 a,float16 b,float_status *status)

{
  long lVar1;
  uint uVar2;
  FloatClass FVar3;
  FloatClass FVar4;
  FloatParts FVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t uVar14;
  uint uVar15;
  FloatParts FVar16;
  FloatParts FVar17;
  FloatParts part;
  
  FVar17._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar17.frac = (ulong)(a & 0x3ff);
  FVar16 = sf_canonicalize(FVar17,&float16_params,status);
  uVar13 = FVar16._8_8_;
  uVar10 = FVar16.frac;
  part._8_8_ = (ulong)(b >> 10 & 0x1f) | (ulong)(b & 0x8000) << 0x19;
  part.frac = (ulong)(b & 0x3ff);
  FVar17 = sf_canonicalize(part,&float16_params,status);
  uVar12 = FVar17._8_8_;
  uVar9 = FVar17.frac;
  uVar2 = FVar16._12_4_;
  uVar15 = uVar2 >> 8;
  FVar3 = FVar16.cls;
  FVar4 = FVar17.cls;
  iVar8 = FVar16.exp;
  iVar11 = FVar17.exp;
  if (FVar16.sign ==
      (((undefined1  [16])FVar17 & (undefined1  [16])0xff0000000000) != (undefined1  [16])0x0)) {
    if (FVar4 == float_class_normal && FVar3 == float_class_normal) {
      iVar7 = iVar8 - iVar11;
      FVar5 = FVar16;
      if (iVar7 == 0 || iVar8 < iVar11) {
        if (iVar8 < iVar11) {
          if (iVar11 - iVar8 < 0x40) {
            bVar6 = (byte)(iVar11 - iVar8);
            uVar10 = (ulong)(uVar10 << (-bVar6 & 0x3f) != 0) | uVar10 >> (bVar6 & 0x3f);
          }
          else {
            uVar10 = (ulong)(uVar10 != 0);
          }
          uVar13 = uVar13 & 0xffffffff00000000 | uVar12 & 0xffffffff;
          FVar5.exp = (int)uVar13;
          FVar5.cls = (char)(uVar13 >> 0x20);
          FVar5.sign = (_Bool)(char)(uVar13 >> 0x28);
          FVar5._14_2_ = (short)(uVar13 >> 0x30);
          FVar5.frac = uVar10;
        }
      }
      else if (iVar7 < 0x40) {
        uVar9 = (ulong)(uVar9 << (-(byte)iVar7 & 0x3f) != 0) | uVar9 >> ((byte)iVar7 & 0x3f);
      }
      else {
        uVar9 = (ulong)(uVar9 != 0);
      }
      uVar10 = FVar5._8_8_;
      uVar9 = FVar5.frac + uVar9;
      FVar16.exp = (int)uVar10;
      FVar16.cls = (char)(uVar10 >> 0x20);
      FVar16.sign = (_Bool)(char)(uVar10 >> 0x28);
      FVar16._14_2_ = (short)(uVar10 >> 0x30);
      FVar16.frac = uVar9;
      if ((long)uVar9 < 0) {
        uVar10 = uVar10 & 0xffffffff00000000 | (ulong)(FVar5.exp + 1);
        FVar16.exp = (int)uVar10;
        FVar16.cls = (char)(uVar10 >> 0x20);
        FVar16.sign = (_Bool)(char)(uVar10 >> 0x28);
        FVar16._14_2_ = (short)(uVar10 >> 0x30);
        FVar16.frac = (ulong)((uint)uVar9 & 1) | uVar9 >> 1;
      }
      goto LAB_006c11d7;
    }
    if (((FVar17._12_4_ | uVar2) & 0xfc) == 0) {
      if ((FVar3 != float_class_inf) && (FVar4 != float_class_zero)) {
        if ((FVar3 != float_class_zero) && (FVar4 != float_class_inf)) {
LAB_006c113d:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                     ,0x428,(char *)0x0);
        }
        uVar10 = uVar12 & 0xffff00ffffffffff |
                 (ulong)(((undefined1  [16])FVar17 & (undefined1  [16])0xff0000000000) !=
                        (undefined1  [16])0x0) << 0x28;
        FVar16.exp = (int)uVar10;
        FVar16.cls = (char)(uVar10 >> 0x20);
        FVar16.sign = (_Bool)(char)(uVar10 >> 0x28);
        FVar16._14_2_ = (short)(uVar10 >> 0x30);
        FVar16.frac = uVar9;
      }
      goto LAB_006c11d7;
    }
  }
  else {
    if (FVar4 == float_class_normal && FVar3 == float_class_normal) {
      if ((iVar11 < iVar8) || ((iVar8 == iVar11 && (uVar9 <= uVar10)))) {
        iVar8 = iVar8 - iVar11;
        if (iVar8 != 0) {
          if (iVar8 < 0x40) {
            uVar9 = (ulong)(uVar9 << (-(byte)iVar8 & 0x3f) != 0) | uVar9 >> ((byte)iVar8 & 0x3f);
          }
          else {
            uVar9 = (ulong)(uVar9 != 0);
          }
        }
        uVar10 = uVar10 - uVar9;
      }
      else {
        iVar11 = iVar11 - iVar8;
        if (iVar11 != 0) {
          if (iVar11 < 0x40) {
            uVar10 = (ulong)(uVar10 << (-(byte)iVar11 & 0x3f) != 0) |
                     uVar10 >> ((byte)iVar11 & 0x3f);
          }
          else {
            uVar10 = (ulong)(uVar10 != 0);
          }
        }
        uVar10 = uVar9 - uVar10;
        uVar13 = uVar13 & 0xffffffff00000000 | uVar12 & 0xffffffff;
        uVar15 = uVar2 >> 8 ^ 1;
      }
      if (uVar10 == 0) {
        uVar9 = uVar13 & 0xffffff00ffffffff | 0x100000000;
        uVar10 = (ulong)(status->float_rounding_mode == '\x01');
        uVar14 = 0;
      }
      else {
        lVar1 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        iVar8 = ((uint)lVar1 ^ 0x3f) - 1;
        uVar14 = uVar10 << ((byte)iVar8 & 0x3f);
        uVar9 = uVar13 & 0xffffffff00000000 | (ulong)(uint)((int)uVar13 - iVar8);
        uVar10 = (ulong)(uVar15 & 1);
      }
      uVar9 = uVar9 & 0xffff00ffffffffff | uVar10 << 0x28;
      FVar16.exp = (int)uVar9;
      FVar16.cls = (char)(uVar9 >> 0x20);
      FVar16.sign = (_Bool)(char)(uVar9 >> 0x28);
      FVar16._14_2_ = (short)(uVar9 >> 0x30);
      FVar16.frac = uVar14;
      goto LAB_006c11d7;
    }
    if (((FVar17._12_4_ | uVar2) & 0xfc) == 0) {
      if (FVar3 == float_class_inf) {
        if (FVar4 == float_class_inf) {
          status->float_exception_flags = status->float_exception_flags | 1;
          FVar16.exp = 0x7fffffff;
          FVar16.cls = float_class_qnan;
          FVar16.sign = false;
          FVar16._14_2_ = 0;
          FVar16.frac = 0x3fffffffffffffff;
        }
      }
      else if ((FVar3 == float_class_zero) && (FVar4 == float_class_zero)) {
        uVar9 = uVar13 & 0xffff00ffffffffff | (ulong)(status->float_rounding_mode == '\x01') << 0x28
        ;
        FVar16.exp = (int)uVar9;
        FVar16.cls = (char)(uVar9 >> 0x20);
        FVar16.sign = (_Bool)(char)(uVar9 >> 0x28);
        FVar16._14_2_ = (short)(uVar9 >> 0x30);
        FVar16.frac = uVar10;
      }
      else if ((FVar3 == float_class_zero) || (FVar4 == float_class_inf)) {
        uVar10 = (uVar12 & 0xffff00ffffffffff | uVar13 & 0xff0000000000) ^ 0x10000000000;
        FVar16.exp = (int)uVar10;
        FVar16.cls = (char)(uVar10 >> 0x20);
        FVar16.sign = (_Bool)(char)(uVar10 >> 0x28);
        FVar16._14_2_ = (short)(uVar10 >> 0x30);
        FVar16.frac = uVar9;
      }
      else if (FVar4 != float_class_zero) goto LAB_006c113d;
      goto LAB_006c11d7;
    }
  }
  FVar16 = pick_nan(FVar16,FVar17,status);
LAB_006c11d7:
  FVar16 = round_canonical(FVar16,status,&float16_params);
  return (ushort)FVar16.frac & 0x3ff | (ushort)((FVar16.exp & 0x1fU) << 10) |
         (ushort)(FVar16._8_8_ >> 0x19) & 0x8000;
}

Assistant:

float16 QEMU_FLATTEN float16_add(float16 a, float16 b, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pb = float16_unpack_canonical(b, status);
    FloatParts pr = addsub_floats(pa, pb, false, status);

    return float16_round_pack_canonical(pr, status);
}